

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBucket::ExplicitFree(LargeHeapBucket *this,void *object,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  uchar uVar3;
  LargeObjectHeader *in_RAX;
  undefined4 *puVar4;
  LargeObjectHeader *this_00;
  Recycler *pRVar5;
  LargeHeapBlock *this_01;
  LargeObjectHeader *local_38;
  LargeObjectHeader *dbgHeader;
  
  local_38 = in_RAX;
  if ((sizeCat + 0xff & 0xffffffffffffff00) != (ulong)(this->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1d7,
                       "(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat)",
                       "HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat");
    if (!bVar2) goto LAB_006f9332;
    *puVar4 = 0;
  }
  this_00 = LargeHeapBlock::GetHeaderFromAddress(object);
  uVar3 = LargeObjectHeader::GetAttributes
                    (this_00,((this->super_HeapBucket).heapInfo)->recycler->Cookie);
  if (uVar3 != '\0') {
    uVar3 = LargeObjectHeader::GetAttributes
                      (this_00,((this->super_HeapBucket).heapInfo)->recycler->Cookie);
    if (uVar3 != ' ') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                         ,0x1d9,
                         "(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit)"
                         ,
                         "header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit"
                        );
      if (!bVar2) goto LAB_006f9332;
      *puVar4 = 0;
    }
  }
  if ((this_00->field_0x1a & 8) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1da,"(!header->isExplicitFreed)","!header->isExplicitFreed");
    if (!bVar2) goto LAB_006f9332;
    *puVar4 = 0;
  }
  this_00->field_0x1a = this_00->field_0x1a | 8;
  if (this_00->objectSize < sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1dc,"(header->objectSize >= sizeCat)","header->objectSize >= sizeCat");
    if (!bVar2) goto LAB_006f9332;
    *puVar4 = 0;
  }
  pRVar5 = HeapBucket::GetRecycler(&this->super_HeapBucket);
  if (((ulong)object & 0xf) == 0 && (void *)0xffff < object) {
    this_01 = (LargeHeapBlock *)HeapBlockMap64::GetHeapBlock(&pRVar5->heapBlockMap,object);
  }
  else {
    this_01 = (LargeHeapBlock *)0x0;
  }
  if (this_01 == (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e0,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar2) goto LAB_006f9332;
    *puVar4 = 0;
  }
  if ((this_01->super_HeapBlock).heapBlockType != LargeBlockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e1,"(heapBlock->IsLargeHeapBlock())","heapBlock->IsLargeHeapBlock()");
    if (!bVar2) goto LAB_006f9332;
    *puVar4 = 0;
  }
  bVar2 = LargeHeapBlock::GetObjectHeader(this_01,object,&local_38);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e5,"(largeHeapBlock->GetObjectHeader(object, &dbgHeader))",
                       "largeHeapBlock->GetObjectHeader(object, &dbgHeader)");
    if (!bVar2) goto LAB_006f9332;
    *puVar4 = 0;
  }
  if (local_38 != this_00) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x1e6,"(dbgHeader == header)","dbgHeader == header");
    if (!bVar2) {
LAB_006f9332:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  FreeObject::SetNext((FreeObject *)object,this->explicitFreeList);
  this->explicitFreeList = (FreeObject *)object;
  LargeObjectHeader::SetAttributes
            (this_00,((this->super_HeapBucket).heapInfo)->recycler->Cookie,' ');
  return;
}

Assistant:

void
LargeHeapBucket::ExplicitFree(void * object, size_t sizeCat)
{
    Assert(HeapInfo::GetMediumObjectAlignedSizeNoCheck(sizeCat) == this->sizeCat);
    LargeObjectHeader * header = LargeHeapBlock::GetHeaderFromAddress(object);
    Assert(header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::NoBit || header->GetAttributes(this->heapInfo->recycler->Cookie) == ObjectInfoBits::LeafBit);
    Assert(!header->isExplicitFreed);
    DebugOnly(header->isExplicitFreed = true);
    Assert(header->objectSize >= sizeCat);

#if DBG
    HeapBlock* heapBlock = this->GetRecycler()->FindHeapBlock(object);
    Assert(heapBlock != nullptr);
    Assert(heapBlock->IsLargeHeapBlock());

    LargeHeapBlock * largeHeapBlock = (LargeHeapBlock *)heapBlock;
    LargeObjectHeader * dbgHeader;
    Assert(largeHeapBlock->GetObjectHeader(object, &dbgHeader));
    Assert(dbgHeader == header);
#endif

    FreeObject * freeObject = (FreeObject *)object;
    freeObject->SetNext(this->explicitFreeList);
    this->explicitFreeList = freeObject;
    header->SetAttributes(this->heapInfo->recycler->Cookie, ObjectInfoBits::LeafBit);       // We can stop scanning it now.


}